

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastpackwithoutmask28_32(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in;
  *out = in[1] << 0x1c | *out;
  puVar1 = out + 1;
  *puVar1 = in[1] >> 4;
  *puVar1 = in[2] << 0x18 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[2] >> 8;
  *puVar1 = in[3] << 0x14 | *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[3] >> 0xc;
  *puVar1 = in[4] << 0x10 | *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[4] >> 0x10;
  *puVar1 = in[5] << 0xc | *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[5] >> 0x14;
  *puVar1 = in[6] << 8 | *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[6] >> 0x18;
  *puVar1 = in[7] << 4 | *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[8];
  *puVar1 = in[9] << 0x1c | *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[9] >> 4;
  *puVar1 = in[10] << 0x18 | *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[10] >> 8;
  *puVar1 = in[0xb] << 0x14 | *puVar1;
  puVar1 = out + 10;
  *puVar1 = in[0xb] >> 0xc;
  *puVar1 = in[0xc] << 0x10 | *puVar1;
  puVar1 = out + 0xb;
  *puVar1 = in[0xc] >> 0x10;
  *puVar1 = in[0xd] << 0xc | *puVar1;
  puVar1 = out + 0xc;
  *puVar1 = in[0xd] >> 0x14;
  *puVar1 = in[0xe] << 8 | *puVar1;
  puVar1 = out + 0xd;
  *puVar1 = in[0xe] >> 0x18;
  *puVar1 = in[0xf] << 4 | *puVar1;
  puVar1 = out + 0xe;
  *puVar1 = in[0x10];
  *puVar1 = in[0x11] << 0x1c | *puVar1;
  puVar1 = out + 0xf;
  *puVar1 = in[0x11] >> 4;
  *puVar1 = in[0x12] << 0x18 | *puVar1;
  puVar1 = out + 0x10;
  *puVar1 = in[0x12] >> 8;
  *puVar1 = in[0x13] << 0x14 | *puVar1;
  puVar1 = out + 0x11;
  *puVar1 = in[0x13] >> 0xc;
  *puVar1 = in[0x14] << 0x10 | *puVar1;
  puVar1 = out + 0x12;
  *puVar1 = in[0x14] >> 0x10;
  *puVar1 = in[0x15] << 0xc | *puVar1;
  puVar1 = out + 0x13;
  *puVar1 = in[0x15] >> 0x14;
  *puVar1 = in[0x16] << 8 | *puVar1;
  puVar1 = out + 0x14;
  *puVar1 = in[0x16] >> 0x18;
  *puVar1 = in[0x17] << 4 | *puVar1;
  puVar1 = out + 0x15;
  *puVar1 = in[0x18];
  *puVar1 = in[0x19] << 0x1c | *puVar1;
  puVar1 = out + 0x16;
  *puVar1 = in[0x19] >> 4;
  *puVar1 = in[0x1a] << 0x18 | *puVar1;
  puVar1 = out + 0x17;
  *puVar1 = in[0x1a] >> 8;
  *puVar1 = in[0x1b] << 0x14 | *puVar1;
  puVar1 = out + 0x18;
  *puVar1 = in[0x1b] >> 0xc;
  *puVar1 = in[0x1c] << 0x10 | *puVar1;
  puVar1 = out + 0x19;
  *puVar1 = in[0x1c] >> 0x10;
  *puVar1 = in[0x1d] << 0xc | *puVar1;
  puVar1 = out + 0x1a;
  *puVar1 = in[0x1d] >> 0x14;
  *puVar1 = in[0x1e] << 8 | *puVar1;
  puVar1 = out + 0x1b;
  *puVar1 = in[0x1e] >> 0x18;
  *puVar1 = in[0x1f] << 4 | *puVar1;
  return out + 0x1c;
}

Assistant:

uint32_t *__fastpackwithoutmask28_32(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (28 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (28 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (28 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (28 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (28 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (28 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (28 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (28 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (28 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (28 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (28 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (28 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (28 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (28 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (28 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (28 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (28 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (28 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (28 - 24);
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (28 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (28 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (28 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (28 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++out;
  *out = ((*in)) >> (28 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++out;
  ++in;

  return out;
}